

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O3

void ex_sum(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  t_symbol *s;
  int iVar1;
  _garray *x;
  long lVar2;
  char *pcVar3;
  float fVar4;
  int size;
  t_word *wvec;
  int local_1c;
  t_word *local_18;
  
  if (argv->ex_type == 7) {
    s = (t_symbol *)(argv->ex_cont).v_vec;
    if (s == (t_symbol *)0x0) {
      optr->ex_type = 2;
      (optr->ex_cont).v_int = 0;
      pcVar3 = "(null)";
    }
    else {
      x = (_garray *)pd_findbyclass(s,garray_class);
      if ((x != (_garray *)0x0) && (iVar1 = garray_getfloatwords(x,&local_1c,&local_18), iVar1 != 0)
         ) {
        fVar4 = 0.0;
        if (0 < (long)local_1c) {
          lVar2 = 0;
          do {
            fVar4 = fVar4 + local_18[lVar2].w_float;
            lVar2 = lVar2 + 1;
          } while (local_1c != lVar2);
        }
        optr->ex_type = 2;
        (optr->ex_cont).v_flt = fVar4;
        return;
      }
      optr->ex_type = 2;
      (optr->ex_cont).v_int = 0;
      pcVar3 = s->s_name;
    }
    pd_error((void *)0x0,"no such table \'%s\'",pcVar3);
  }
  else {
    post("expr: sum: need a table name\n");
    optr->ex_type = 1;
    (optr->ex_cont).v_int = 0;
  }
  return;
}

Assistant:

void
ex_sum(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        t_symbol *s;
        t_garray *garray;
        int size;
        t_word *wvec;
        t_float sum;
        int indx;

        if (argv->ex_type != ET_SYM)
        {
                post("expr: sum: need a table name\n");
                optr->ex_type = ET_INT;
                optr->ex_int = 0;
                return;
        }

        s = (fts_symbol_t ) argv->ex_ptr;

        ISTABLE(s, garray, size, wvec);

        for (indx = 0, sum = 0; indx < size; indx++)
                sum += wvec[indx].w_float;

        optr->ex_type = ET_FLT;
        optr->ex_flt = sum;
}